

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderPrimitiveCoverage::iterate(TessellationShaderPrimitiveCoverage *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference p_Var4;
  _tessellation_levels *set_1;
  __normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_b8;
  __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_b0;
  _tessellation_levels_set_const_iterator set_iterator_1;
  _tessellation_levels *set;
  __normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_68;
  __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_60;
  _tessellation_levels_set_const_iterator set_iterator;
  _tessellation_levels_set levels_sets;
  GLfloat GStack_38;
  GLint gl_max_tess_gen_level_value;
  GLfloat outer_tess_levels_single [4];
  GLfloat inner_tess_levels_single [2];
  bool has_test_passed;
  Functions *gl;
  TessellationShaderPrimitiveCoverage *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  initTest(this);
  stack0xffffffffffffffdc = 0x3f8000003f800000;
  _GStack_38 = 0x3f8000003f800000;
  outer_tess_levels_single[0] = 1.0;
  outer_tess_levels_single[1] = 1.0;
  levels_sets.
  super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
             (undefined1 *)
             ((long)&levels_sets.
                     super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2ef);
  drawPatch(this,this->m_triangles_tessellation_po_id,3,3,outer_tess_levels_single + 3,&GStack_38);
  inner_tess_levels_single[0]._3_1_ = verifyDrawBufferContents(this);
  TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
            ((_tessellation_levels_set *)&set_iterator,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
             levels_sets.
             super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
             TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
  local_68._M_current =
       (_tessellation_levels *)
       std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::begin
                 ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                   *)&set_iterator);
  __gnu_cxx::
  __normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
  ::__normal_iterator<glcts::_tessellation_levels*>
            ((__normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
              *)&local_60,&local_68);
  while( true ) {
    set = (_tessellation_levels *)
          std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
          end((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
              &set_iterator);
    bVar1 = __gnu_cxx::operator!=
                      (&local_60,
                       (__normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                        *)&set);
    if (!bVar1) break;
    p_Var4 = __gnu_cxx::
             __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
             ::operator*(&local_60);
    drawPatch(this,this->m_triangles_tessellation_po_id,3,3,p_Var4->inner,p_Var4->outer);
    bVar1 = verifyDrawBufferContents(this);
    inner_tess_levels_single[0]._3_1_ = (inner_tess_levels_single[0]._3_1_ & bVar1) != 0;
    __gnu_cxx::
    __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
    ::operator++(&local_60,0);
  }
  drawPatch(this,this->m_quad_tessellation_po_id,4,6,outer_tess_levels_single + 3,&GStack_38);
  bVar1 = verifyDrawBufferContents(this);
  inner_tess_levels_single[0]._3_1_ = (bool)(bVar1 & inner_tess_levels_single[0]._3_1_);
  TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
            ((_tessellation_levels_set *)&set_iterator_1,TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
             levels_sets.
             super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
             TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
  std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::operator=
            ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
             &set_iterator,
             (vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
             &set_iterator_1);
  std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::~vector
            ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
             &set_iterator_1);
  local_b8._M_current =
       (_tessellation_levels *)
       std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::begin
                 ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                   *)&set_iterator);
  __gnu_cxx::
  __normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
  ::__normal_iterator<glcts::_tessellation_levels*>
            ((__normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
              *)&local_b0,&local_b8);
  while( true ) {
    set_1 = (_tessellation_levels *)
            std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
            end((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *
                )&set_iterator);
    bVar1 = __gnu_cxx::operator!=
                      (&local_b0,
                       (__normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                        *)&set_1);
    if (!bVar1) break;
    p_Var4 = __gnu_cxx::
             __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
             ::operator*(&local_b0);
    drawPatch(this,this->m_quad_tessellation_po_id,4,6,p_Var4->inner,p_Var4->outer);
    bVar1 = verifyDrawBufferContents(this);
    inner_tess_levels_single[0]._3_1_ = (inner_tess_levels_single[0]._3_1_ & bVar1) != 0;
    __gnu_cxx::
    __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
    ::operator++(&local_b0,0);
  }
  if (inner_tess_levels_single[0]._3_1_ == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::~vector
            ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
             &set_iterator);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderPrimitiveCoverage::iterate(void)
{
	/* Retriveing GL. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize test */
	initTest();

	bool has_test_passed = true;

	/* Define tessellation level values that we will use to draw single tessellated primitive */
	const glw::GLfloat inner_tess_levels_single[] = { 1.0f, 1.0f };
	const glw::GLfloat outer_tess_levels_single[] = { 1.0f, 1.0f, 1.0f, 1.0f };

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Verify no cracks can be found if a degenerate triangle
	 * is outputted by the tessellator */
	drawPatch(m_triangles_tessellation_po_id, 3 /* n_patch_vertices */, 3 /* n_triangle_vertices */,
			  inner_tess_levels_single, outer_tess_levels_single);

	has_test_passed &= verifyDrawBufferContents();

	/* Verify no cracks can be found if multiple triangles
	 * are outputted by the tessellator.
	 */
	_tessellation_levels_set levels_sets = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
		TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, gl_max_tess_gen_level_value,
		TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

	for (_tessellation_levels_set_const_iterator set_iterator = levels_sets.begin(); set_iterator != levels_sets.end();
		 set_iterator++)
	{
		const _tessellation_levels& set = *set_iterator;

		drawPatch(m_triangles_tessellation_po_id, 3 /* n_patch_vertices */, 3 /* n_triangle_vertices */, set.inner,
				  set.outer);

		has_test_passed &= verifyDrawBufferContents();
	}

	/* Verify no cracks can be found if a degenerate quad
	 * is outputted by the tessellator.
	 */
	drawPatch(m_quad_tessellation_po_id, 4 /* n_patch_vertices */, 6 /* n_triangle_vertices (quad == 2 triangles) */,
			  inner_tess_levels_single, outer_tess_levels_single);

	has_test_passed &= verifyDrawBufferContents();

	/* Verify no cracks can be found if multiple triangles
	 * (to which the generated quads will be broken into)
	 * are outputted by the tessellator.
	 */
	levels_sets = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
		TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS, gl_max_tess_gen_level_value,
		TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

	for (_tessellation_levels_set_const_iterator set_iterator = levels_sets.begin(); set_iterator != levels_sets.end();
		 set_iterator++)
	{
		const _tessellation_levels& set = *set_iterator;

		drawPatch(m_quad_tessellation_po_id, 4 /* n_patch_vertices */,
				  6 /* n_triangle_vertices (quad == 2 triangles) */, set.inner, set.outer);
		has_test_passed &= verifyDrawBufferContents();
	}

	/* Has the test passed? */
	if (has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}